

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::chained_buffer::append_buffer<libtorrent::span<char>>
          (chained_buffer *this,span<char> buffer,int used_size)

{
  reference b_00;
  buffer_t *b;
  int used_size_local;
  chained_buffer *this_local;
  span<char> buffer_local;
  
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::emplace_back<>(&this->m_vec);
  b_00 = ::std::
         deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
         ::back(&this->m_vec);
  init_buffer_entry<libtorrent::span<char>>(this,b_00,buffer,used_size);
  return;
}

Assistant:

void append_buffer(Holder buffer, int used_size)
		{
			TORRENT_ASSERT(is_single_thread());
			TORRENT_ASSERT(int(buffer.size()) >= used_size);
			m_vec.emplace_back();
			buffer_t& b = m_vec.back();
			init_buffer_entry<Holder>(b, std::move(buffer), used_size);
		}